

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MatrixBandPartLayerParams::Clear(MatrixBandPartLayerParams *this)

{
  this->numlower_ = 0;
  this->numupper_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void MatrixBandPartLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MatrixBandPartLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&numlower_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&numupper_) -
      reinterpret_cast<char*>(&numlower_)) + sizeof(numupper_));
  _internal_metadata_.Clear<std::string>();
}